

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seastest.c
# Opt level: O0

double * seasdummy(double *x,int N,int f,int *rows,int *cols)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  double *A;
  double dVar2;
  double *oup;
  double *fmatrix;
  double *tt;
  int local_30;
  int iter;
  int j;
  int i;
  int *cols_local;
  int *rows_local;
  int f_local;
  int N_local;
  double *x_local;
  
  if (f < 2) {
    printf("Non-Seasonal Data \n");
    exit(-1);
  }
  __ptr = malloc((long)N << 3);
  __ptr_00 = malloc((long)N * 0x10 * (long)f);
  A = (double *)malloc((long)N * 8 * (long)(f + -1));
  for (iter = 0; iter < N; iter = iter + 1) {
    *(double *)((long)__ptr + (long)iter * 8) = (double)iter + 1.0;
  }
  for (iter = 0; iter < N; iter = iter + 1) {
    iVar1 = iter * 2 * f;
    for (local_30 = 1; local_30 <= f; local_30 = local_30 + 1) {
      dVar2 = sin(((double)local_30 * 6.283185307179586 * *(double *)((long)__ptr + (long)iter * 8))
                  / (double)f);
      *(double *)((long)__ptr_00 + (long)(iVar1 + local_30 * 2 + -1) * 8) = dVar2;
      dVar2 = cos(((double)local_30 * 6.283185307179586 * *(double *)((long)__ptr + (long)iter * 8))
                  / (double)f);
      *(double *)((long)__ptr_00 + (long)(iVar1 + (local_30 + -1) * 2) * 8) = dVar2;
    }
  }
  printf("PIVAL %g",0x400921fb54442d18);
  for (iter = 0; iter < N; iter = iter + 1) {
    memcpy(A + iter * (f + -1),(void *)((long)__ptr_00 + (long)(iter * 2 * f) * 8),
           (long)(f + -1) << 3);
  }
  itranspose(A,N,f + -1);
  *rows = f + -1;
  *cols = N;
  free(__ptr);
  free(__ptr_00);
  return A;
}

Assistant:

double* seasdummy(double *x, int N,int f,int *rows, int *cols) {
    int i,j,iter;
    double *tt;
    double *fmatrix,*oup;
    if ( f <= 1) {
        printf("Non-Seasonal Data \n");
        exit(-1);
    }

    tt = (double*) malloc(sizeof(double)*N);
    fmatrix = (double*)malloc(sizeof(double)*N*2*f);
    oup = (double*)malloc(sizeof(double)*N*(f-1));

    for(i = 0; i < N;++i) {
        tt[i] = (double) i + 1;
    }

    for(i = 0; i < N; ++i) {
        iter = i * 2 * f;
        for(j = 1; j <= f; ++j) {
            fmatrix[iter + 2 * j - 1 ] = sin(2 * (double) PIVAL * j * tt[i] / (double) f);
            fmatrix[iter + 2 * (j - 1) ] = cos(2 * (double) PIVAL * j * tt[i] /(double) f);
            //printf("%d %d \n",iter + 2 * j,iter + 2 * j+1);
        }
    }

    printf("PIVAL %g",PIVAL);

    //mdisplay(fmatrix,N,2*f);

    for(i = 0; i < N;++i) {
        memcpy(oup + i * (f-1),fmatrix + i * 2 * f,sizeof(double)* (f-1));
    }

    itranspose(oup,N,f-1);

    *rows = f-1;
    *cols = N;

    free(tt);
    free(fmatrix);
    return oup;
}